

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandUtil.cpp
# Opt level: O2

void llbuild::commands::util::emitError
               (StringRef filename,StringRef message,Token *at,Parser *parser)

{
  uint length;
  uint line;
  uint column;
  char *position;
  Lexer *pLVar1;
  
  position = at->start;
  length = at->length;
  line = at->line;
  column = at->column;
  pLVar1 = ninja::Parser::getLexer(parser);
  ::emitError(filename,message,position,length,line,column,pLVar1->buffer);
  return;
}

Assistant:

void util::emitError(StringRef filename, StringRef message,
                     const ninja::Token& at, const ninja::Parser* parser) {
  ::emitError(filename, message, at.start, at.length, at.line, at.column,
            parser->getLexer().getBuffer());
}